

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser_error parse_constants_mon_gen(parser *p)

{
  wchar_t wVar1;
  int iVar2;
  parser_error pVar3;
  void *pvVar4;
  char *__s1;
  undefined2 uVar5;
  
  pvVar4 = parser_priv(p);
  __s1 = parser_getsym(p,"label");
  wVar1 = parser_getint(p,"value");
  if (wVar1 < L'\0') {
    pVar3 = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    iVar2 = strcmp(__s1,"chance");
    uVar5 = (undefined2)wVar1;
    if (iVar2 == 0) {
      *(undefined2 *)((long)pvVar4 + 0x30) = uVar5;
    }
    else {
      iVar2 = strcmp(__s1,"level-min");
      if (iVar2 == 0) {
        *(undefined2 *)((long)pvVar4 + 0x32) = uVar5;
      }
      else {
        iVar2 = strcmp(__s1,"town-day");
        if (iVar2 == 0) {
          *(undefined2 *)((long)pvVar4 + 0x34) = uVar5;
        }
        else {
          iVar2 = strcmp(__s1,"town-night");
          if (iVar2 == 0) {
            *(undefined2 *)((long)pvVar4 + 0x36) = uVar5;
          }
          else {
            iVar2 = strcmp(__s1,"repro-max");
            if (iVar2 == 0) {
              *(undefined2 *)((long)pvVar4 + 0x38) = uVar5;
            }
            else {
              iVar2 = strcmp(__s1,"ood-chance");
              if (iVar2 == 0) {
                *(undefined2 *)((long)pvVar4 + 0x3a) = uVar5;
              }
              else {
                iVar2 = strcmp(__s1,"ood-amount");
                if (iVar2 == 0) {
                  *(undefined2 *)((long)pvVar4 + 0x3c) = uVar5;
                }
                else {
                  iVar2 = strcmp(__s1,"group-max");
                  if (iVar2 == 0) {
                    *(undefined2 *)((long)pvVar4 + 0x3e) = uVar5;
                  }
                  else {
                    iVar2 = strcmp(__s1,"group-dist");
                    if (iVar2 != 0) {
                      return PARSE_ERROR_UNDEFINED_DIRECTIVE;
                    }
                    *(undefined2 *)((long)pvVar4 + 0x40) = uVar5;
                  }
                }
              }
            }
          }
        }
      }
    }
    pVar3 = PARSE_ERROR_NONE;
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_constants_mon_gen(struct parser *p) {
	struct angband_constants *z;
	const char *label;
	int value;

	z = parser_priv(p);
	label = parser_getsym(p, "label");
	value = parser_getint(p, "value");

	if (value < 0)
		return PARSE_ERROR_INVALID_VALUE;

	if (streq(label, "chance"))
		z->alloc_monster_chance = value;
	else if (streq(label, "level-min"))
		z->level_monster_min = value;
	else if (streq(label, "town-day"))
		z->town_monsters_day = value;
	else if (streq(label, "town-night"))
		z->town_monsters_night = value;
	else if (streq(label, "repro-max"))
		z->repro_monster_max = value;
	else if (streq(label, "ood-chance"))
		z->ood_monster_chance = value;
	else if (streq(label, "ood-amount"))
		z->ood_monster_amount = value;
	else if (streq(label, "group-max"))
		z->monster_group_max = value;
	else if (streq(label, "group-dist"))
		z->monster_group_dist = value;
	else
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;

	return PARSE_ERROR_NONE;
}